

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger table_filter(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  SQObjectPtr *o;
  SQObjectPtr ret;
  SQObjectPtr local_70;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr itr;
  
  pSVar3 = stack_get(v,1);
  this = (pSVar3->super_SQObject)._unVal.pTable;
  ret.super_SQObject._unVal.pTable = SQTable::Create(v->_sharedstate,0);
  ret.super_SQObject._type = OT_TABLE;
  pSVar1 = &((ret.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  itr.super_SQObject._type = OT_NULL;
  itr.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  do {
    SVar4 = SQTable::Next(this,false,&itr,&key,&val);
    if (SVar4 == -1) {
      SQVM::Push(v,&ret);
      SVar4 = 1;
LAB_0012125a:
      SQObjectPtr::~SQObjectPtr(&val);
      SQObjectPtr::~SQObjectPtr(&key);
      SQObjectPtr::~SQObjectPtr(&itr);
      SQObjectPtr::~SQObjectPtr(&ret);
      return SVar4;
    }
    SQObjectPtr::operator=(&itr,SVar4);
    local_70.super_SQObject._type = (pSVar3->super_SQObject)._type;
    local_70.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
    if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_70);
    SQObjectPtr::~SQObjectPtr(&local_70);
    SQVM::Push(v,&key);
    SQVM::Push(v,&val);
    SVar5 = sq_call(v,3,1,0);
    if (SVar5 < 0) {
      SVar4 = -1;
      goto LAB_0012125a;
    }
    o = SQVM::GetUp(v,-1);
    bVar2 = SQVM::IsFalse(o);
    if (!bVar2) {
      SQTable::NewSlot(ret.super_SQObject._unVal.pTable,&key,&val);
    }
    SQVM::Pop(v);
  } while( true );
}

Assistant:

static SQInteger table_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQTable *tbl = _table(o);
    SQObjectPtr ret = SQTable::Create(_ss(v),0);

    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = tbl->Next(false, itr, key, val)) != -1) {
        itr = (SQInteger)nitr;

        v->Push(o);
        v->Push(key);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _table(ret)->NewSlot(key, val);
        }
        v->Pop();
    }

    v->Push(ret);
    return 1;
}